

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

string * __thiscall FMB::FiniteModelMultiSorted::toString_abi_cxx11_(FiniteModelMultiSorted *this)

{
  char cVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  string *psVar9;
  ostream *poVar10;
  DArray<int> *this_00;
  int *piVar11;
  DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pDVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  void *pvVar14;
  Term *pTVar15;
  ulong uVar16;
  size_t sVar17;
  char *pcVar18;
  DArray<unsigned_int> *in_RSI;
  string *in_RDI;
  uint argSort_1;
  TermList argSortT_1;
  uint j_2;
  char res_3;
  uint s_2;
  uint i_10;
  uint mult_1;
  uint var_1;
  uint argS_2;
  TermList argST_2;
  uint i_9;
  bool first_1;
  uint i_8;
  uint offset_1;
  uint argS_1;
  TermList argST_1;
  uint i_7;
  OperatorType *sig_1;
  string name_3;
  uint arity_3;
  Symbol *symb_3;
  uint p_1;
  char res_2;
  string name_2;
  Symbol *symb_2;
  uint arity_2;
  uint p;
  uint resultSort;
  TermList resultSortT;
  uint argSort;
  TermList argSortT;
  uint j_1;
  uint res_1;
  uint s_1;
  uint i_6;
  uint mult;
  uint var;
  uint argS;
  TermList argST;
  uint i_5;
  bool first;
  uint i_4;
  uint offset;
  uint i_3;
  OperatorType *sig;
  string name_1;
  uint arity_1;
  Symbol *symb_1;
  uint f_1;
  string sortName_1;
  string cname_1;
  uint srt;
  TermList srtT;
  uint res;
  string name;
  uint arity;
  Symbol *symb;
  uint f;
  uint j;
  uint i_2;
  uint c;
  uint i_1;
  string cname;
  int frep;
  uint i;
  string sortNameLabel;
  string sortName;
  uint size;
  uint s;
  bool printIntroduced;
  ostringstream modelStm;
  void *in_stack_fffffffffffff078;
  Signature *in_stack_fffffffffffff080;
  OperatorType *in_stack_fffffffffffff088;
  Symbol *in_stack_fffffffffffff090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0a0;
  undefined4 in_stack_fffffffffffff0a8;
  uint in_stack_fffffffffffff0ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0c0;
  char *in_stack_fffffffffffff168;
  string *in_stack_fffffffffffff170;
  FiniteModelMultiSorted *in_stack_fffffffffffff178;
  Term *in_stack_fffffffffffff198;
  TermList in_stack_fffffffffffff1a0;
  FiniteModelMultiSorted *in_stack_fffffffffffff1a8;
  undefined8 in_stack_fffffffffffff1b8;
  uint local_8c8;
  uint local_8b0;
  int local_8ac;
  uint local_8a8;
  uint local_898;
  uint local_890;
  string local_888 [32];
  string local_868 [36];
  uint local_844;
  uint64_t local_840;
  uint local_834;
  string local_830 [32];
  string local_810 [32];
  OperatorType *local_7f0;
  string local_7e8 [36];
  uint local_7c4;
  Symbol *local_7c0;
  uint local_7b4;
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [39];
  char local_729;
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  Symbol *local_6c8;
  uint local_6bc;
  uint local_6b8;
  uint local_6b4;
  uint64_t local_6b0;
  uint local_6a4;
  uint64_t local_6a0;
  uint local_698;
  uint local_694;
  uint64_t local_690;
  uint local_684;
  uint local_680;
  int local_67c;
  uint local_678;
  uint local_674;
  uint64_t local_670;
  uint local_668;
  byte local_661;
  uint local_660;
  uint local_65c;
  string local_658 [32];
  string local_638 [32];
  uint64_t local_618;
  string local_610 [32];
  uint64_t local_5f0;
  string local_5e8 [36];
  uint local_5c4;
  string local_5c0 [32];
  string local_5a0 [32];
  OperatorType *local_580;
  string local_578 [36];
  uint local_554;
  Symbol *local_550;
  uint local_544;
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [36];
  undefined4 local_49c;
  string local_498 [36];
  uint local_474;
  uint64_t local_470;
  uint local_464;
  string local_460 [36];
  uint local_43c;
  Symbol *local_438;
  uint local_430;
  uint local_42c;
  uint local_428;
  uint local_424;
  string local_420 [32];
  string local_400 [36];
  uint local_3dc;
  string local_3d8 [32];
  string local_3b8 [38];
  byte local_392;
  byte local_391;
  string local_390 [37];
  byte local_36b;
  byte local_36a;
  allocator<char> local_369;
  string local_368 [32];
  string local_348 [38];
  byte local_322;
  byte local_321;
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [36];
  int local_2bc;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [36];
  uint local_234;
  string local_230 [32];
  string local_210 [38];
  byte local_1ea;
  allocator<char> local_1e9;
  string local_1e8 [32];
  string local_1c8 [36];
  uint local_1a4;
  uint local_1a0;
  byte local_189;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_189 = 0;
  if ((toString[abi:cxx11]()::cnames_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&toString[abi:cxx11]()::cnames_abi_cxx11_), iVar4 != 0)) {
    Lib::
    DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::DArray((DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff090,(size_t)in_stack_fffffffffffff088);
    __cxa_atexit(Lib::
                 DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~DArray,&toString[abi:cxx11]()::cnames_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&toString[abi:cxx11]()::cnames_abi_cxx11_);
  }
  Kernel::Signature::typeCons((Signature *)0x2d2d91);
  Lib::
  DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ensure((DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),
           (size_t)in_stack_fffffffffffff0a0);
  for (local_1a0 = 0; uVar6 = local_1a0, uVar5 = Kernel::Signature::typeCons((Signature *)0x2d2ddc),
      uVar6 < uVar5; local_1a0 = local_1a0 + 1) {
    puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI,(ulong)local_1a0);
    local_1a4 = *puVar8;
    if ((local_1a4 != 0) &&
       (bVar2 = Kernel::Signature::isInterpretedNonDefault(DAT_01333830,local_1a0), !bVar2)) {
      psVar9 = Kernel::Signature::typeConName_abi_cxx11_
                         (in_stack_fffffffffffff080,(int)((ulong)in_stack_fffffffffffff078 >> 0x20))
      ;
      std::__cxx11::string::string(local_1c8,(string *)psVar9);
      local_1ea = 0;
      bVar2 = Kernel::Signature::isBoolCon(DAT_01333830,local_1a0);
      if (bVar2) {
        std::allocator<char>::allocator();
        local_1ea = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff0c0,(char *)in_stack_fffffffffffff0b8,
                   (allocator<char> *)in_stack_fffffffffffff0b0);
      }
      else {
        std::__cxx11::string::string(local_1e8,local_1c8);
      }
      if ((local_1ea & 1) != 0) {
        std::allocator<char>::~allocator(&local_1e9);
      }
      bVar2 = Kernel::Signature::isDefaultSortCon(DAT_01333830,local_1a0);
      if (!bVar2) {
        poVar10 = std::operator<<((ostream *)local_188,"tff(");
        std::__cxx11::string::string(local_230,local_1e8);
        prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
                (string *)in_stack_fffffffffffff198);
        poVar10 = std::operator<<(poVar10,local_210);
        poVar10 = std::operator<<(poVar10,",type,");
        poVar10 = std::operator<<(poVar10,local_1c8);
        poVar10 = std::operator<<(poVar10,":$tType).");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_210);
        std::__cxx11::string::~string(local_230);
      }
      Lib::
      DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,(ulong)local_1a0);
      Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::ensure((DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),
               (size_t)in_stack_fffffffffffff0a0);
      for (local_234 = 1; local_234 <= local_1a4; local_234 = local_234 + 1) {
        poVar10 = std::operator<<((ostream *)local_188,"tff(");
        std::__cxx11::string::string(local_298,local_1e8);
        prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
                (string *)in_stack_fffffffffffff198);
        Lib::Int::toString_abi_cxx11_((uint)((ulong)in_stack_fffffffffffff1b8 >> 0x20));
        std::__cxx11::string::c_str();
        append(in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168);
        poVar10 = std::operator<<(poVar10,local_258);
        std::operator<<(poVar10,",type,");
        std::__cxx11::string::~string(local_258);
        std::__cxx11::string::~string(local_2b8);
        std::__cxx11::string::~string(local_278);
        std::__cxx11::string::~string(local_298);
        this_00 = Lib::DArray<Lib::DArray<int>_>::operator[]
                            ((DArray<Lib::DArray<int>_> *)(in_RSI + 5),(ulong)local_1a0);
        piVar11 = Lib::DArray<int>::operator[](this_00,(ulong)local_234);
        local_2bc = *piVar11;
        local_321 = 0;
        local_322 = 0;
        local_36a = 0;
        local_36b = 0;
        local_391 = 0;
        local_392 = 0;
        if (local_2bc < 0) {
          std::__cxx11::string::string(local_320,local_1e8);
          local_321 = 1;
          prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
                  (string *)in_stack_fffffffffffff198);
          local_322 = 1;
          std::allocator<char>::allocator();
          local_36a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff0c0,(char *)in_stack_fffffffffffff0b8,
                     (allocator<char> *)in_stack_fffffffffffff0b0);
          local_36b = 1;
          Lib::Int::toString_abi_cxx11_((uint)((ulong)in_stack_fffffffffffff1b8 >> 0x20));
          local_391 = 1;
          std::operator+(in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
          local_392 = 1;
          std::__cxx11::string::c_str();
          append(in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168);
        }
        else {
          psVar9 = Kernel::Signature::functionName_abi_cxx11_
                             ((Signature *)
                              CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),
                              (int)((ulong)in_stack_fffffffffffff0a0 >> 0x20));
          std::__cxx11::string::string(local_2e0,(string *)psVar9);
        }
        if ((local_392 & 1) != 0) {
          std::__cxx11::string::~string(local_348);
        }
        if ((local_391 & 1) != 0) {
          std::__cxx11::string::~string(local_390);
        }
        if ((local_36b & 1) != 0) {
          std::__cxx11::string::~string(local_368);
        }
        if ((local_36a & 1) != 0) {
          std::allocator<char>::~allocator(&local_369);
        }
        if ((local_322 & 1) != 0) {
          std::__cxx11::string::~string(local_300);
        }
        if ((local_321 & 1) != 0) {
          std::__cxx11::string::~string(local_320);
        }
        pDVar12 = Lib::
                  DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,(ulong)local_1a0);
        pbVar13 = Lib::
                  DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator[](pDVar12,(ulong)local_234);
        std::__cxx11::string::operator=((string *)pbVar13,local_2e0);
        poVar10 = std::operator<<((ostream *)local_188,local_2e0);
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = std::operator<<(poVar10,local_1c8);
        poVar10 = std::operator<<(poVar10,").");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_2e0);
      }
      poVar10 = std::operator<<((ostream *)local_188,"tff(");
      std::__cxx11::string::string(local_3d8,local_1e8);
      prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
              (string *)in_stack_fffffffffffff198);
      poVar10 = std::operator<<(poVar10,local_3b8);
      poVar10 = std::operator<<(poVar10,",axiom,");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::string::~string(local_3d8);
      poVar10 = std::operator<<((ostream *)local_188,"      ! [X:");
      poVar10 = std::operator<<(poVar10,local_1c8);
      poVar10 = std::operator<<(poVar10,"] : (");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)local_188,"         ");
      for (local_3dc = 1; local_3dc <= local_1a4; local_3dc = local_3dc + 1) {
        poVar10 = std::operator<<((ostream *)local_188,"X = ");
        pDVar12 = Lib::
                  DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,(ulong)local_1a0);
        pbVar13 = Lib::
                  DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator[](pDVar12,(ulong)local_3dc);
        std::operator<<(poVar10,(string *)pbVar13);
        if (local_3dc < local_1a4) {
          std::operator<<((ostream *)local_188," | ");
        }
        if (local_3dc == local_1a4) {
          std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
        }
        else if (local_3dc % 5 == 0) {
          poVar10 = (ostream *)
                    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
          std::operator<<(poVar10,"         ");
        }
      }
      poVar10 = std::operator<<((ostream *)local_188,"      ) ).");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
      if (1 < local_1a4) {
        poVar10 = std::operator<<((ostream *)local_188,"tff(");
        std::__cxx11::string::string(local_420,local_1e8);
        prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
                (string *)in_stack_fffffffffffff198);
        poVar10 = std::operator<<(poVar10,local_400);
        poVar10 = std::operator<<(poVar10,",axiom,");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_400);
        std::__cxx11::string::~string(local_420);
        std::operator<<((ostream *)local_188,"         ");
        local_424 = 0;
        for (local_428 = 1; uVar6 = local_428, local_428 <= local_1a4; local_428 = local_428 + 1) {
          while (local_42c = uVar6 + 1, local_42c <= local_1a4) {
            local_424 = local_424 + 1;
            pDVar12 = Lib::
                      DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,(ulong)local_1a0);
            pbVar13 = Lib::
                      DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](pDVar12,(ulong)local_428);
            poVar10 = std::operator<<((ostream *)local_188,(string *)pbVar13);
            poVar10 = std::operator<<(poVar10," != ");
            pDVar12 = Lib::
                      DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,(ulong)local_1a0);
            pbVar13 = Lib::
                      DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](pDVar12,(ulong)local_42c);
            std::operator<<(poVar10,(string *)pbVar13);
            if ((local_428 == local_1a4 - 1) && (local_42c == local_1a4)) {
              std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
              uVar6 = local_42c;
            }
            else {
              std::operator<<((ostream *)local_188," & ");
              uVar6 = local_42c;
              if (local_424 % 5 == 0) {
                poVar10 = (ostream *)
                          std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>)
                ;
                std::operator<<(poVar10,"         ");
                uVar6 = local_42c;
              }
            }
          }
        }
        poVar10 = std::operator<<((ostream *)local_188,").");
        pvVar14 = (void *)std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_1c8);
    }
  }
  for (local_430 = 0; uVar6 = local_430, uVar5 = Kernel::Signature::functions((Signature *)0x2d3f3d)
      , uVar6 < uVar5; local_430 = local_430 + 1) {
    local_438 = Kernel::Signature::getFunction
                          (in_stack_fffffffffffff080,
                           (uint)((ulong)in_stack_fffffffffffff078 >> 0x20));
    uVar6 = Kernel::Signature::Symbol::usageCnt(local_438);
    if (((uVar6 != 0) && (local_43c = Kernel::Signature::Symbol::arity(local_438), local_43c == 0))
       && (((local_189 & 1) != 0 ||
           (bVar2 = Kernel::Signature::Symbol::introduced(local_438), !bVar2)))) {
      psVar9 = Kernel::Signature::Symbol::name_abi_cxx11_(local_438);
      std::__cxx11::string::string(local_460,(string *)psVar9);
      puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI + 1,(ulong)local_430);
      puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI + 3,(ulong)*puVar8);
      local_464 = *puVar8;
      Kernel::Signature::Symbol::fnType(in_stack_fffffffffffff090);
      local_470 = (uint64_t)Kernel::OperatorType::result(in_stack_fffffffffffff088);
      pTVar15 = Kernel::TermList::term((TermList *)0x2d40f9);
      local_474 = Kernel::Term::functor(pTVar15);
      pDVar12 = Lib::
                DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,(ulong)local_474);
      pbVar13 = Lib::
                DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator[](pDVar12,(ulong)local_464);
      std::__cxx11::string::string(local_498,(string *)pbVar13);
      _Var3 = std::operator==(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098);
      if (_Var3) {
        local_49c = 0x13;
      }
      else {
        psVar9 = Kernel::Signature::typeConName_abi_cxx11_
                           (in_stack_fffffffffffff080,
                            (int)((ulong)in_stack_fffffffffffff078 >> 0x20));
        std::__cxx11::string::string(local_4c0,(string *)psVar9);
        poVar10 = std::operator<<((ostream *)local_188,"tff(");
        std::__cxx11::string::string(local_500,local_460);
        prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
                (string *)in_stack_fffffffffffff198);
        poVar10 = std::operator<<(poVar10,local_4e0);
        poVar10 = std::operator<<(poVar10,",type,");
        poVar10 = std::operator<<(poVar10,local_460);
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = std::operator<<(poVar10,local_4c0);
        poVar10 = std::operator<<(poVar10,").");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_4e0);
        std::__cxx11::string::~string(local_500);
        if (local_464 == 0) {
          poVar10 = std::operator<<((ostream *)local_188,"% ");
          poVar10 = std::operator<<(poVar10,local_460);
          poVar10 = std::operator<<(poVar10," undefined in model");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar10 = std::operator<<((ostream *)local_188,"tff(");
          std::__cxx11::string::string(local_540,local_460);
          append(in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168);
          poVar10 = std::operator<<(poVar10,local_520);
          poVar10 = std::operator<<(poVar10,",axiom,");
          poVar10 = std::operator<<(poVar10,local_460);
          poVar10 = std::operator<<(poVar10," = ");
          poVar10 = std::operator<<(poVar10,local_498);
          poVar10 = std::operator<<(poVar10,").");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_520);
          std::__cxx11::string::~string(local_540);
        }
        std::__cxx11::string::~string(local_4c0);
        local_49c = 0;
      }
      std::__cxx11::string::~string(local_498);
      std::__cxx11::string::~string(local_460);
    }
  }
  for (local_544 = 0; uVar6 = local_544, uVar5 = Kernel::Signature::functions((Signature *)0x2d4675)
      , uVar6 < uVar5; local_544 = local_544 + 1) {
    local_550 = Kernel::Signature::getFunction
                          (in_stack_fffffffffffff080,
                           (uint)((ulong)in_stack_fffffffffffff078 >> 0x20));
    uVar6 = Kernel::Signature::Symbol::usageCnt(local_550);
    if (((uVar6 != 0) && (local_554 = Kernel::Signature::Symbol::arity(local_550), local_554 != 0))
       && (((local_189 & 1) != 0 ||
           (bVar2 = Kernel::Signature::Symbol::introduced(local_550), !bVar2)))) {
      psVar9 = Kernel::Signature::Symbol::name_abi_cxx11_(local_550);
      std::__cxx11::string::string(local_578,(string *)psVar9);
      local_580 = Kernel::Signature::Symbol::fnType(in_stack_fffffffffffff090);
      poVar10 = std::operator<<((ostream *)local_188,"tff(");
      std::__cxx11::string::string(local_5c0,local_578);
      prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
              (string *)in_stack_fffffffffffff198);
      poVar10 = std::operator<<(poVar10,local_5a0);
      poVar10 = std::operator<<(poVar10,",type,");
      poVar10 = std::operator<<(poVar10,local_578);
      std::operator<<(poVar10,": (");
      std::__cxx11::string::~string(local_5a0);
      std::__cxx11::string::~string(local_5c0);
      for (local_5c4 = 0; local_5c4 < local_554; local_5c4 = local_5c4 + 1) {
        local_5f0 = (uint64_t)
                    Kernel::OperatorType::arg
                              (in_stack_fffffffffffff088,
                               (uint)((ulong)in_stack_fffffffffffff080 >> 0x20));
        Kernel::TermList::toString_abi_cxx11_
                  ((TermList *)in_stack_fffffffffffff0b8,
                   SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
        std::operator<<((ostream *)local_188,local_5e8);
        std::__cxx11::string::~string(local_5e8);
        if (local_5c4 + 1 < local_554) {
          std::operator<<((ostream *)local_188," * ");
        }
      }
      poVar10 = std::operator<<((ostream *)local_188,") > ");
      local_618 = (uint64_t)Kernel::OperatorType::result(in_stack_fffffffffffff088);
      Kernel::TermList::toString_abi_cxx11_
                ((TermList *)in_stack_fffffffffffff0b8,
                 SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
      poVar10 = std::operator<<(poVar10,local_610);
      poVar10 = std::operator<<(poVar10,").");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_610);
      poVar10 = std::operator<<((ostream *)local_188,"tff(");
      std::__cxx11::string::string(local_658,local_578);
      prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
              (string *)in_stack_fffffffffffff198);
      poVar10 = std::operator<<(poVar10,local_638);
      poVar10 = std::operator<<(poVar10,",axiom,");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_638);
      std::__cxx11::string::~string(local_658);
      puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI + 1,(ulong)local_544);
      local_65c = *puVar8;
      if ((toString[abi:cxx11]()::args == '\0') &&
         (iVar4 = __cxa_guard_acquire(&toString[abi:cxx11]()::args), iVar4 != 0)) {
        Lib::DArray<unsigned_int>::DArray
                  ((DArray<unsigned_int> *)in_stack_fffffffffffff090,
                   (size_t)in_stack_fffffffffffff088);
        __cxa_atexit(Lib::DArray<unsigned_int>::~DArray,&toString::args,&__dso_handle);
        __cxa_guard_release(&toString[abi:cxx11]()::args);
      }
      Lib::DArray<unsigned_int>::ensure
                ((DArray<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),
                 (size_t)in_stack_fffffffffffff0a0);
      for (local_660 = 0; local_660 < local_554; local_660 = local_660 + 1) {
        puVar8 = Lib::DArray<unsigned_int>::operator[](&toString::args,(ulong)local_660);
        *puVar8 = 1;
      }
      puVar8 = Lib::DArray<unsigned_int>::operator[](&toString::args,(ulong)(local_554 - 1));
      *puVar8 = 0;
      local_661 = 1;
      local_668 = local_554;
      while (local_668 = local_668 - 1, local_668 != 0xffffffff) {
        local_670 = (uint64_t)
                    Kernel::OperatorType::arg
                              (in_stack_fffffffffffff088,
                               (uint)((ulong)in_stack_fffffffffffff080 >> 0x20));
        pTVar15 = Kernel::TermList::term((TermList *)0x2d4d96);
        local_674 = Kernel::Term::functor(pTVar15);
        puVar8 = Lib::DArray<unsigned_int>::operator[](&toString::args,(ulong)local_668);
        uVar6 = *puVar8;
        puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI,(ulong)local_674);
        if (uVar6 == *puVar8) {
          puVar8 = Lib::DArray<unsigned_int>::operator[](&toString::args,(ulong)local_668);
          *puVar8 = 1;
        }
        else {
          puVar8 = Lib::DArray<unsigned_int>::operator[](&toString::args,(ulong)local_668);
          *puVar8 = *puVar8 + 1;
          local_678 = local_65c;
          local_67c = 1;
          for (local_680 = 0; uVar16 = (ulong)local_680,
              sVar17 = Lib::DArray<unsigned_int>::size(&toString::args), iVar4 = local_67c,
              uVar16 < sVar17; local_680 = local_680 + 1) {
            puVar8 = Lib::DArray<unsigned_int>::operator[](&toString::args,(ulong)local_680);
            local_678 = local_678 + iVar4 * (*puVar8 - 1);
            local_690 = (uint64_t)
                        Kernel::OperatorType::arg
                                  (in_stack_fffffffffffff088,
                                   (uint)((ulong)in_stack_fffffffffffff080 >> 0x20));
            pTVar15 = Kernel::TermList::term((TermList *)0x2d4f77);
            local_684 = Kernel::Term::functor(pTVar15);
            puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI,(ulong)local_684);
            local_67c = *puVar8 * local_67c;
          }
          puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI + 3,(ulong)local_678);
          local_694 = *puVar8;
          if (local_694 == 0) {
            std::operator<<((ostream *)local_188,"%         ");
          }
          else {
            if ((local_661 & 1) == 0) {
              std::operator<<((ostream *)local_188,"         & ");
            }
            else {
              std::operator<<((ostream *)local_188,"           ");
            }
            local_661 = 0;
          }
          poVar10 = std::operator<<((ostream *)local_188,local_578);
          std::operator<<(poVar10,"(");
          for (local_698 = 0; local_698 < local_554; local_698 = local_698 + 1) {
            if (local_698 != 0) {
              std::operator<<((ostream *)local_188,",");
            }
            local_6a0 = (uint64_t)
                        Kernel::OperatorType::arg
                                  (in_stack_fffffffffffff088,
                                   (uint)((ulong)in_stack_fffffffffffff080 >> 0x20));
            pTVar15 = Kernel::TermList::term((TermList *)0x2d5140);
            local_6a4 = Kernel::Term::functor(pTVar15);
            pDVar12 = Lib::
                      DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,(ulong)local_6a4);
            puVar8 = Lib::DArray<unsigned_int>::operator[](&toString::args,(ulong)local_698);
            pbVar13 = Lib::
                      DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](pDVar12,(ulong)*puVar8);
            std::operator<<((ostream *)local_188,(string *)pbVar13);
          }
          if (local_694 == 0) {
            poVar10 = std::operator<<((ostream *)local_188,") undefined in model");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            local_668 = local_554;
          }
          else {
            local_6b0 = (uint64_t)Kernel::OperatorType::result(in_stack_fffffffffffff088);
            pTVar15 = Kernel::TermList::term((TermList *)0x2d5240);
            local_6b4 = Kernel::Term::functor(pTVar15);
            poVar10 = std::operator<<((ostream *)local_188,") = ");
            pDVar12 = Lib::
                      DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,(ulong)local_6b4);
            pbVar13 = Lib::
                      DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](pDVar12,(ulong)local_694);
            poVar10 = std::operator<<(poVar10,(string *)pbVar13);
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            local_668 = local_554;
          }
        }
      }
      poVar10 = (ostream *)
                std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<(poVar10,").");
      pvVar14 = (void *)std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_578);
    }
  }
  for (local_6b8 = 1; uVar6 = local_6b8,
      uVar5 = Kernel::Signature::predicates((Signature *)0x2d5423), uVar6 < uVar5;
      local_6b8 = local_6b8 + 1) {
    local_6bc = Kernel::Signature::predicateArity
                          (in_stack_fffffffffffff080,(int)((ulong)in_stack_fffffffffffff078 >> 0x20)
                          );
    if (((local_6bc == 0) &&
        ((local_6c8 = Kernel::Signature::getPredicate
                                (in_stack_fffffffffffff080,
                                 (uint)((ulong)in_stack_fffffffffffff078 >> 0x20)),
         (local_189 & 1) != 0 || (bVar2 = Kernel::Signature::Symbol::introduced(local_6c8), !bVar2))
        )) && (uVar6 = Kernel::Signature::Symbol::usageCnt(local_6c8), uVar6 != 0)) {
      psVar9 = Kernel::Signature::Symbol::name_abi_cxx11_(local_6c8);
      std::__cxx11::string::string(local_6e8,(string *)psVar9);
      poVar10 = std::operator<<((ostream *)local_188,"tff(");
      std::__cxx11::string::string(local_728,local_6e8);
      prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
              (string *)in_stack_fffffffffffff198);
      poVar10 = std::operator<<(poVar10,local_708);
      poVar10 = std::operator<<(poVar10,",type,");
      poVar10 = std::operator<<(poVar10,local_6e8);
      poVar10 = std::operator<<(poVar10,": $o).");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_708);
      std::__cxx11::string::~string(local_728);
      puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI + 2,(ulong)local_6b8);
      pcVar18 = Lib::DArray<char>::operator[]((DArray<char> *)(in_RSI + 4),(ulong)*puVar8);
      local_729 = *pcVar18;
      if (local_729 == '\x02') {
        poVar10 = std::operator<<((ostream *)local_188,"tff(");
        std::__cxx11::string::string(local_770,local_6e8);
        append(in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168);
        poVar10 = std::operator<<(poVar10,local_750);
        poVar10 = std::operator<<(poVar10,",axiom,");
        poVar10 = std::operator<<(poVar10,local_6e8);
        poVar10 = std::operator<<(poVar10,").");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_750);
        std::__cxx11::string::~string(local_770);
      }
      else if (local_729 == '\x01') {
        poVar10 = std::operator<<((ostream *)local_188,"tff(");
        std::__cxx11::string::string(local_7b0,local_6e8);
        append(in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168);
        poVar10 = std::operator<<(poVar10,local_790);
        poVar10 = std::operator<<(poVar10,",axiom,~");
        poVar10 = std::operator<<(poVar10,local_6e8);
        poVar10 = std::operator<<(poVar10,").");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_790);
        std::__cxx11::string::~string(local_7b0);
      }
      else {
        poVar10 = std::operator<<((ostream *)local_188,"% ");
        poVar10 = std::operator<<(poVar10,local_6e8);
        poVar10 = std::operator<<(poVar10," undefined");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string(local_6e8);
    }
  }
  for (local_7b4 = 1; uVar6 = local_7b4,
      uVar5 = Kernel::Signature::predicates((Signature *)0x2d5aa0), uVar6 < uVar5;
      local_7b4 = local_7b4 + 1) {
    local_7c0 = Kernel::Signature::getPredicate
                          (in_stack_fffffffffffff080,
                           (uint)((ulong)in_stack_fffffffffffff078 >> 0x20));
    local_7c4 = Kernel::Signature::Symbol::arity(local_7c0);
    if ((local_7c4 != 0) &&
       ((((local_189 & 1) != 0 || (bVar2 = Kernel::Signature::Symbol::introduced(local_7c0), !bVar2)
         ) && (uVar6 = Kernel::Signature::Symbol::usageCnt(local_7c0), uVar6 != 0)))) {
      psVar9 = Kernel::Signature::Symbol::name_abi_cxx11_(local_7c0);
      std::__cxx11::string::string(local_7e8,(string *)psVar9);
      local_7f0 = Kernel::Signature::Symbol::predType(in_stack_fffffffffffff090);
      poVar10 = std::operator<<((ostream *)local_188,"tff(");
      std::__cxx11::string::string(local_830,local_7e8);
      prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
              (string *)in_stack_fffffffffffff198);
      poVar10 = std::operator<<(poVar10,local_810);
      poVar10 = std::operator<<(poVar10,",type,");
      in_stack_fffffffffffff1a8 = (FiniteModelMultiSorted *)std::operator<<(poVar10,local_7e8);
      std::operator<<((ostream *)in_stack_fffffffffffff1a8,": (");
      std::__cxx11::string::~string(local_810);
      std::__cxx11::string::~string(local_830);
      for (local_834 = 0; local_834 < local_7c4; local_834 = local_834 + 1) {
        in_stack_fffffffffffff1a0 =
             Kernel::OperatorType::arg
                       (in_stack_fffffffffffff088,(uint)((ulong)in_stack_fffffffffffff080 >> 0x20));
        local_840 = in_stack_fffffffffffff1a0._content;
        in_stack_fffffffffffff198 = Kernel::TermList::term((TermList *)0x2d5d12);
        local_844 = Kernel::Term::functor(in_stack_fffffffffffff198);
        psVar9 = Kernel::Signature::typeConName_abi_cxx11_
                           (in_stack_fffffffffffff080,
                            (int)((ulong)in_stack_fffffffffffff078 >> 0x20));
        std::operator<<((ostream *)local_188,(string *)psVar9);
        if (local_834 + 1 < local_7c4) {
          std::operator<<((ostream *)local_188," * ");
        }
      }
      poVar10 = std::operator<<((ostream *)local_188,") > $o).");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)local_188,"tff(");
      std::__cxx11::string::string(local_888,local_7e8);
      prepend(in_stack_fffffffffffff1a8,(char *)in_stack_fffffffffffff1a0._content,
              (string *)in_stack_fffffffffffff198);
      poVar10 = std::operator<<(poVar10,local_868);
      poVar10 = std::operator<<(poVar10,",axiom,");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_868);
      std::__cxx11::string::~string(local_888);
      puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI + 2,(ulong)local_7b4);
      uVar6 = *puVar8;
      if ((toString[abi:cxx11]()::args == '\0') &&
         (iVar4 = __cxa_guard_acquire(&toString[abi:cxx11]()::args), iVar4 != 0)) {
        Lib::DArray<unsigned_int>::DArray
                  ((DArray<unsigned_int> *)in_stack_fffffffffffff090,
                   (size_t)in_stack_fffffffffffff088);
        __cxa_atexit(Lib::DArray<unsigned_int>::~DArray,&toString[abi:cxx11]()::args,&__dso_handle);
        __cxa_guard_release(&toString[abi:cxx11]()::args);
      }
      Lib::DArray<unsigned_int>::ensure
                ((DArray<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),
                 (size_t)in_stack_fffffffffffff0a0);
      for (local_890 = 0; local_890 < local_7c4; local_890 = local_890 + 1) {
        puVar8 = Lib::DArray<unsigned_int>::operator[]
                           (&toString[abi:cxx11]()::args,(ulong)local_890);
        *puVar8 = 1;
      }
      puVar8 = Lib::DArray<unsigned_int>::operator[]
                         (&toString[abi:cxx11]()::args,(ulong)(local_7c4 - 1));
      *puVar8 = 0;
      bVar2 = true;
      local_898 = local_7c4;
      while (local_898 = local_898 - 1, local_898 != 0xffffffff) {
        Kernel::OperatorType::arg
                  (in_stack_fffffffffffff088,(uint)((ulong)in_stack_fffffffffffff080 >> 0x20));
        pTVar15 = Kernel::TermList::term((TermList *)0x2d611a);
        uVar7 = Kernel::Term::functor(pTVar15);
        puVar8 = Lib::DArray<unsigned_int>::operator[]
                           (&toString[abi:cxx11]()::args,(ulong)local_898);
        uVar5 = *puVar8;
        puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI,(ulong)uVar7);
        if (uVar5 == *puVar8) {
          puVar8 = Lib::DArray<unsigned_int>::operator[]
                             (&toString[abi:cxx11]()::args,(ulong)local_898);
          *puVar8 = 1;
        }
        else {
          puVar8 = Lib::DArray<unsigned_int>::operator[]
                             (&toString[abi:cxx11]()::args,(ulong)local_898);
          *puVar8 = *puVar8 + 1;
          local_8ac = 1;
          local_8a8 = uVar6;
          for (local_8b0 = 0; sVar17 = Lib::DArray<unsigned_int>::size(&toString[abi:cxx11]()::args)
              , local_8b0 < sVar17; local_8b0 = local_8b0 + 1) {
            puVar8 = Lib::DArray<unsigned_int>::operator[]
                               (&toString[abi:cxx11]()::args,(ulong)local_8b0);
            local_8a8 = local_8a8 + local_8ac * (*puVar8 - 1);
            Kernel::OperatorType::arg
                      (in_stack_fffffffffffff088,(uint)((ulong)in_stack_fffffffffffff080 >> 0x20));
            pTVar15 = Kernel::TermList::term((TermList *)0x2d62ef);
            uVar5 = Kernel::Term::functor(pTVar15);
            puVar8 = Lib::DArray<unsigned_int>::operator[](in_RSI,(ulong)uVar5);
            local_8ac = *puVar8 * local_8ac;
          }
          pcVar18 = Lib::DArray<char>::operator[]((DArray<char> *)(in_RSI + 4),(ulong)local_8a8);
          cVar1 = *pcVar18;
          if (cVar1 < '\x01') {
            std::operator<<((ostream *)local_188,"%         ");
          }
          else {
            if (bVar2) {
              std::operator<<((ostream *)local_188,"           ");
            }
            else {
              std::operator<<((ostream *)local_188,"         & ");
            }
            bVar2 = false;
          }
          if (cVar1 == '\x01') {
            std::operator<<((ostream *)local_188,"~");
          }
          poVar10 = std::operator<<((ostream *)local_188,local_7e8);
          std::operator<<(poVar10,"(");
          for (local_8c8 = 0; local_8c8 < local_7c4; local_8c8 = local_8c8 + 1) {
            if (local_8c8 != 0) {
              std::operator<<((ostream *)local_188,",");
            }
            Kernel::OperatorType::arg
                      (in_stack_fffffffffffff088,(uint)((ulong)in_stack_fffffffffffff080 >> 0x20));
            pTVar15 = Kernel::TermList::term((TermList *)0x2d64bc);
            in_stack_fffffffffffff0ac = Kernel::Term::functor(pTVar15);
            in_stack_fffffffffffff0a0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Lib::
                 DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&toString[abi:cxx11]()::cnames_abi_cxx11_,
                              (ulong)in_stack_fffffffffffff0ac);
            puVar8 = Lib::DArray<unsigned_int>::operator[]
                               (&toString[abi:cxx11]()::args,(ulong)local_8c8);
            in_stack_fffffffffffff090 =
                 (Symbol *)
                 Lib::
                 DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator[]((DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffff0a0,(ulong)*puVar8);
            std::operator<<((ostream *)local_188,(string *)in_stack_fffffffffffff090);
          }
          std::operator<<((ostream *)local_188,")");
          if (cVar1 == '\0') {
            std::operator<<((ostream *)local_188," undefined in model");
          }
          std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
          local_898 = local_7c4;
        }
      }
      in_stack_fffffffffffff088 =
           (OperatorType *)
           std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffff080 =
           (Signature *)std::operator<<((ostream *)in_stack_fffffffffffff088,").");
      in_stack_fffffffffffff078 =
           (void *)std::ostream::operator<<
                             (in_stack_fffffffffffff080,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(in_stack_fffffffffffff078,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_7e8);
    }
  }
  std::__cxx11::ostringstream::str();
  local_49c = 1;
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string FiniteModelMultiSorted::toString()
{
  std::ostringstream modelStm;

  bool printIntroduced = false;

  static DArray<DArray<std::string>> cnames;
  cnames.ensure(env.signature->typeCons());

  //Output sorts and their sizes
  for(unsigned s=0;s<env.signature->typeCons();s++){
    unsigned size = _sizes[s];
    if(size==0) continue;

    // don't output interpreted sorts at all, we know what they are
    if(env.signature->isInterpretedNonDefault(s))
      continue;

    std::string sortName = env.signature->typeConName(s);
    std::string sortNameLabel = (env.signature->isBoolCon(s)) ? "bool" : sortName;

    // skip declaring $i, we know what it is
    if(!env.signature->isDefaultSortCon(s))
      // Sort declaration
      modelStm << "tff(" << prepend("declare_", sortNameLabel) << ",type,"<<sortName<<":$tType)." <<endl;

    cnames[s].ensure(size+1);

    // Domain constant declarations
    for(unsigned i=1;i<=size;i++){
      modelStm << "tff(" << append(prepend("declare_", sortNameLabel), Int::toString(i).c_str()) << ",type,";
      int frep = sortRepr[s][i];
      std::string cname = (frep >= 0) ? env.signature->functionName(frep) : append(prepend("fmb_", sortNameLabel),(std::string("_")+Lib::Int::toString(i)).c_str());
      cnames[s][i]=cname;
      modelStm << cname << ":" << sortName << ")." << endl;
    }

    //Output domain
    modelStm << "tff(" << prepend("finite_domain_", sortNameLabel) << ",axiom," << endl;
    modelStm << "      ! [X:" << sortName << "] : (" << endl;
    modelStm << "         ";
    for(unsigned i=1;i<=size;i++){
      modelStm << "X = " << cnames[s][i];
      if(i<size) modelStm << " | ";
      if(i==size) modelStm << endl;
      else if(i%5==0) modelStm << endl << "         ";
    }
    modelStm << "      ) )." <<endl;
    //Distinctness of domain
    modelStm << endl;
    if(size>1){
    modelStm << "tff(" << prepend("distinct_domain_", sortNameLabel) << ",axiom," << endl;
    modelStm << "         ";
    unsigned c=0;
    for(unsigned i=1;i<=size;i++){
      for(unsigned j=i+1;j<=size;j++){
        c++;
        modelStm << cnames[s][i] <<" != " << cnames[s][j];
        if(!(i==size-1 && j==size)){
           modelStm << " & ";
           if(c%5==0){ modelStm << endl << "         "; }
        }
        else{ modelStm << endl; }
      }
    }
    modelStm << ")." << endl << endl;
    }
  }

  //Constants
  for(unsigned f=0;f<env.signature->functions();f++){
    Signature::Symbol* symb = env.signature->getFunction(f);
    if(symb->usageCnt()==0) continue;
    unsigned arity = symb->arity();
    if(arity>0) continue;
    if(!printIntroduced && symb->introduced()) continue;
    std::string name = symb->name();
    unsigned res = _f_interpretation[_f_offsets[f]];
    TermList srtT = symb->fnType()->result();
    unsigned srt = srtT.term()->functor();
    std::string cname = cnames[srt][res];
    if(name == cname) continue;

    std::string sortName = env.signature->typeConName(srt);
    modelStm << "tff("<<prepend("declare_", name)<<",type,"<<name<<":"<<sortName<<")."<<endl;
    if(res>0){
      modelStm << "tff("<<append(name,"_definition")<<",axiom,"<<name<<" = " << cname << ")."<<endl;
    }
    else{
      modelStm << "% " << name << " undefined in model" << endl;
    }
  }

  //Functions
  for(unsigned f=0;f<env.signature->functions();f++){
    Signature::Symbol* symb = env.signature->getFunction(f);
    if(symb->usageCnt()==0) continue;
    unsigned arity = symb->arity();
    if(arity==0) continue;
    if(!printIntroduced && symb->introduced()) continue;
    std::string name = symb->name();
    OperatorType* sig = symb->fnType();
    modelStm << "tff("<<prepend("declare_", name)<<",type,"<<name<<": (";
    for(unsigned i=0;i<arity;i++){
      modelStm << sig->arg(i).toString();
      if(i+1 < arity) modelStm << " * ";
    }
    modelStm << ") > " << sig->result().toString() << ")." << endl;

    modelStm << "tff("<<prepend("function_", name)<<",axiom,"<<endl;

    unsigned offset = _f_offsets[f];

    static DArray<unsigned> args;
    args.ensure(arity);
    for(unsigned i=0;i<arity;i++) args[i]=1;
    args[arity-1]=0;
    bool first=true;
fModelLabel:
      for(unsigned i=arity-1;i+1!=0;i--){

        TermList argST = sig->arg(i);
        unsigned argS = argST.term()->functor();
        if(args[i]==_sizes[argS]){
          args[i]=1;
        }
        else{
          args[i]++;

          //TODO could probably compute this directly, instead of via args
          // my mind isn't in the right place to do that now though!
          unsigned var = offset;
          unsigned mult=1;
          for(unsigned i=0;i<args.size();i++){
            var += mult*(args[i]-1);
            unsigned s = sig->arg(i).term()->functor();
            mult *= _sizes[s];
          }
          unsigned res = _f_interpretation[var];

          if(res>0){
            if(!first){ modelStm << "         & " ; }
            else{ modelStm << "           " ; }
            first=false;
          }
          else{
            modelStm << "%         ";
          }
          modelStm << name << "(";
          for(unsigned j=0;j<arity;j++){
            if(j!=0) modelStm << ",";
            TermList argSortT = sig->arg(j);
            unsigned argSort = argSortT.term()->functor();
            modelStm << cnames[argSort][args[j]];
          }
          if(res>0){
            TermList resultSortT = sig->result();
            unsigned resultSort = resultSortT.term()->functor();
            modelStm << ") = " << cnames[resultSort][res] << endl;
          }
          else{
            modelStm << ") undefined in model" << endl;
          }
          goto fModelLabel;
        }
      }
      modelStm << endl << ")." << endl << endl;
  }

  //Propositions
  for(unsigned p=1;p<env.signature->predicates();p++){
    unsigned arity = env.signature->predicateArity(p);
    if(arity>0) continue;
    Signature::Symbol* symb = env.signature->getPredicate(p);
    if(!printIntroduced && symb->introduced()) continue;
    if(symb->usageCnt() == 0) continue;
    std::string name = symb->name();
    modelStm << "tff("<<prepend("declare_", name)<<",type,"<<name<<": $o)."<<endl;
    char res = _p_interpretation[_p_offsets[p]];
    if(res==INTP_TRUE){
      modelStm << "tff("<<append(name,"_definition")<<",axiom,"<<name<< ")."<<endl;
    }
    else if(res==INTP_FALSE){
      modelStm << "tff("<<append(name,"_definition")<<",axiom,~"<<name<< ")."<<endl;
    }
    else{
      modelStm << "% " << name << " undefined" << endl;
    }
  }

  //Predicates
  for(unsigned p=1;p<env.signature->predicates();p++){
    Signature::Symbol* symb = env.signature->getPredicate(p);
    unsigned arity = symb->arity();
    if(arity==0) continue;
    if(!printIntroduced && symb->introduced()) continue;
    if(symb->usageCnt() == 0) continue;
    std::string name = symb->name();
    OperatorType* sig = symb->predType();
    modelStm << "tff("<<prepend("declare_", name)<<",type,"<<name<<": (";
    for(unsigned i=0;i<arity;i++){
      TermList argST = sig->arg(i);
      unsigned argS = argST.term()->functor();
      modelStm << env.signature->typeConName(argS);
      if(i+1 < arity) modelStm << " * ";
    }
    modelStm << ") > $o)." << endl;

    modelStm << "tff("<<prepend("predicate_", name)<<",axiom,"<<endl;

    unsigned offset = _p_offsets[p];

    static DArray<unsigned> args;
    args.ensure(arity);
    for(unsigned i=0;i<arity;i++) args[i]=1;
    args[arity-1]=0;
    bool first=true;
pModelLabel:
      for(unsigned i=arity-1;i+1!=0;i--){
        TermList argST = sig->arg(i);
        unsigned argS = argST.term()->functor();
        if(args[i]==_sizes[argS]){
          args[i]=1;
        }
        else{
          args[i]++;

          //TODO could probably compute this directly, instead of via args
          // my mind isn't in the right place to do that now though!
          unsigned var = offset;
          unsigned mult=1;
          for(unsigned i=0;i<args.size();i++){
            var += mult*(args[i]-1);
            unsigned s = sig->arg(i).term()->functor();
            mult *= _sizes[s];
          }
          char res = _p_interpretation[var];
          if(res>INTP_UNDEF){
            if(!first){ modelStm << "         & " ; }
            else{ modelStm << "           " ; }
            first=false;
          }
          else{
            modelStm << "%         ";
          }
          if(res==INTP_FALSE) modelStm << "~";
          modelStm << name << "(";
          for(unsigned j=0;j<arity;j++){
            if(j!=0) modelStm << ",";
            TermList argSortT = sig->arg(j);
            unsigned argSort = argSortT.term()->functor();
            modelStm << cnames[argSort][args[j]];
          }
          modelStm << ")";
          if(res==INTP_UNDEF){
            modelStm << " undefined in model";
          }
          modelStm << endl;
          goto pModelLabel;
        }
      }
      modelStm << endl << ")." << endl << endl;
  }

  return modelStm.str();
}